

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AvgTest8bpp_avg_8x8_quad_MaxValue_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::AvgTest8bpp_avg_8x8_quad_MaxValue_Test>
           *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<int,_int,_int,_int,_int,_void_(*)(const_unsigned_char_*,_int,_int,_int,_int_*)>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x48);
  anon_unknown.dwarf_fe241b::AvgTest8bpp_avg_8x8_quad_MaxValue_Test::
  AvgTest8bpp_avg_8x8_quad_MaxValue_Test((AvgTest8bpp_avg_8x8_quad_MaxValue_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }